

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result,double baseValue)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  precise_unit *in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double converted_val;
  precise_unit *in_stack_00000060;
  double in_stack_00000068;
  precise_unit *in_stack_ffffffffffffff68;
  precise_unit *in_stack_ffffffffffffff70;
  unit_data base;
  precise_unit *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  precise_unit *this;
  double in_stack_fffffffffffffff8;
  
  bVar1 = precise_unit::operator==(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (((!bVar1) && (bVar1 = is_default(in_stack_ffffffffffffff70), !bVar1)) &&
     (bVar1 = is_default(in_stack_ffffffffffffff70), !bVar1)) {
    precise_unit::base_units(in_RDI);
    precise_unit::base_units(in_RSI);
    bVar1 = detail::unit_data::operator==
                      ((unit_data *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (unit_data *)in_stack_ffffffffffffff78);
    if (bVar1) {
      dVar4 = precise_unit::multiplier(in_RDI);
      dVar5 = precise_unit::multiplier(in_RSI);
      in_XMM0_Qa = (precise_unit *)(((double)in_XMM0_Qa * dVar4) / dVar5);
    }
    else {
      bVar1 = precise_unit::is_per_unit((precise_unit *)0x5bddf6);
      bVar2 = precise_unit::is_per_unit((precise_unit *)0x5bde09);
      if (bVar1 == bVar2) {
        bVar1 = precise_unit::has_e_flag((precise_unit *)0x5bde2a);
        base = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
        if ((bVar1) || (bVar1 = precise_unit::has_e_flag((precise_unit *)0x5bde38), bVar1)) {
          precise_unit::base_units(in_RSI);
          bVar1 = precise_unit::has_same_base(in_stack_ffffffffffffff68,base);
          if (bVar1) {
            dVar4 = detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                              (in_stack_fffffffffffffff8,in_XMM0_Qa,in_RDI,(double)in_RSI);
            uVar3 = std::isnan(dVar4);
            if ((uVar3 & 1) == 0) {
              return dVar4;
            }
          }
        }
        in_XMM0_Qa = (precise_unit *)
                     convert<units::precise_unit,units::precise_unit>
                               (in_stack_00000068,in_stack_00000060,(precise_unit *)converted_val);
      }
      else {
        this = in_RDI;
        precise_unit::base_units(in_RSI);
        bVar1 = precise_unit::has_same_base
                          (in_stack_ffffffffffffff68,
                           SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0));
        bVar2 = true;
        if (!bVar1) {
          unit_cast(in_RDI);
          bVar1 = unit::operator==((unit *)in_RDI,(unit *)in_stack_ffffffffffffff70);
          bVar2 = true;
          if (!bVar1) {
            unit_cast(in_RDI);
            bVar2 = unit::operator==((unit *)in_RDI,(unit *)in_stack_ffffffffffffff70);
          }
        }
        if (bVar2 == false) {
          in_XMM0_Qa = (precise_unit *)0x7ff4000000000000;
        }
        else {
          bVar1 = precise_unit::is_per_unit((precise_unit *)0x5bdf86);
          if (bVar1) {
            in_XMM0_Qa = (precise_unit *)((double)in_XMM0_Qa * in_XMM1_Qa);
          }
          dVar4 = precise_unit::multiplier(this);
          dVar4 = (double)in_XMM0_Qa * dVar4;
          dVar5 = precise_unit::multiplier(in_RSI);
          in_XMM0_Qa = (precise_unit *)(dVar4 / dVar5);
          bVar1 = precise_unit::is_per_unit((precise_unit *)0x5bdffb);
          if (bVar1) {
            in_XMM0_Qa = (precise_unit *)((double)in_XMM0_Qa / in_XMM1_Qa);
          }
        }
      }
    }
  }
  return (double)in_XMM0_Qa;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}